

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

string * __thiscall pbrt::ShapeHandle::ToString_abi_cxx11_(ShapeHandle *this)

{
  void *pvVar1;
  allocator<char> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  anon_class_1_0_00000001 tostr;
  allocator<char> local_11;
  allocator<char> *__a;
  string *__s;
  
  __a = in_RSI;
  __s = in_RDI;
  pvVar1 = TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           ::ptr((TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                  *)in_RSI);
  if (pvVar1 == (void *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,(char *)__s,__a);
    std::allocator<char>::~allocator(&local_11);
  }
  else {
    TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
    ::DispatchCPU<pbrt::ShapeHandle::ToString[abi:cxx11]()const::__0>
              ((TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                *)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string ShapeHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto tostr = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(tostr);
}